

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::DrawAndCheck<int>
          (AttributeFormatTest *this,GLint size,bool normalized)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  string result_str;
  int reference [8];
  int result [8];
  string reference_str;
  int local_218 [4];
  int iStack_208;
  int local_204;
  int iStack_200;
  int iStack_1fc;
  int iStack_1f8;
  int local_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int iStack_1e8;
  undefined8 local_1e4;
  int local_1dc;
  string local_1d8 [32];
  stringstream ss;
  ostringstream local_1b0 [8];
  undefined1 local_1a8 [376];
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar8 + 0x1680))(this->m_po);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91b);
  (**(code **)(lVar8 + 0xd8))(this->m_vao);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91e);
  uVar12 = 0;
  (**(code **)(lVar8 + 0x30))(0);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x922);
  (**(code **)(lVar8 + 0x538))(0,0,2);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x925);
  (**(code **)(lVar8 + 0x638))();
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x928);
  lVar9 = (**(code **)(lVar8 + 0xcf8))(0x8c8e,35000);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x92c);
  result[4] = 0;
  result[5] = 0;
  result[6] = 0;
  result[7] = 0;
  result[0] = 0;
  result[1] = 0;
  result[2] = 0;
  result[3] = 0;
  uVar5 = size * 2;
  uVar11 = 0;
  if (0 < (int)uVar5) {
    uVar11 = (ulong)uVar5;
  }
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    result[uVar12] = *(int *)(lVar9 + uVar12 * 4);
  }
  (**(code **)(lVar8 + 0x1670))(0x8c8e);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x936);
  if (normalized) {
    uVar15 = 0x3fb00000;
  }
  else {
    uVar15 = 0x3ff00000;
  }
  local_218[0] = 0;
  dVar1 = (double)((ulong)uVar15 << 0x20);
  dVar2 = (double)((ulong)uVar15 << 0x20);
  local_218[1] = (int)(double)((ulong)uVar15 << 0x20);
  local_218[2] = (int)((double)((ulong)uVar15 << 0x20) + (double)((ulong)uVar15 << 0x20));
  local_218[3] = (int)(dVar1 * 3.0);
  iStack_208 = (int)(dVar2 * 4.0);
  local_204 = (int)(dVar1 * 5.0);
  iStack_200 = (int)(dVar2 * 6.0);
  iStack_1fc = (int)(dVar1 * 7.0);
  iStack_1f8 = (int)(dVar2 * 8.0);
  local_1f4 = (int)(dVar1 * 9.0);
  iStack_1f0 = (int)(dVar2 * 10.0);
  iStack_1ec = (int)(dVar1 * 11.0);
  iStack_1e8 = (int)(dVar2 * 12.0);
  local_1e4 = CONCAT44((int)(dVar2 * 14.0),(int)(dVar1 * 13.0));
  local_1dc = (int)((double)((ulong)uVar15 << 0x20) * 15.0);
  reference[4] = 0;
  reference[5] = 0;
  reference[6] = 0;
  reference[7] = 0;
  reference[0] = 0;
  reference[1] = 0;
  reference[2] = 0;
  reference[3] = 0;
  iVar6 = 0;
  uVar12 = 0;
  if (0 < size) {
    uVar12 = (ulong)(uint)size;
  }
  iVar10 = 0;
  for (iVar13 = 0; uVar14 = uVar12, iVar3 = iVar10, iVar4 = iVar6, iVar13 != 2; iVar13 = iVar13 + 1)
  {
    while (uVar14 != 0) {
      reference[iVar3] = local_218[size + iVar4] + local_218[iVar4];
      uVar14 = uVar14 - 1;
      iVar3 = iVar3 + 1;
      iVar4 = iVar4 + 1;
    }
    iVar10 = iVar10 + size;
    iVar6 = iVar6 + uVar5;
  }
  uVar12 = 0;
  do {
    uVar14 = uVar12;
    if (uVar11 == uVar14) goto LAB_00b1f167;
    uVar12 = uVar14 + 1;
  } while (reference[uVar14] == result[uVar14]);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reference_str,"[ ",(allocator<char> *)&ss);
  for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1a8,reference[uVar12]);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)&reference_str);
    std::__cxx11::string::~string((string *)&result_str);
    std::__cxx11::string::append((char *)&reference_str);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result_str,"[ ",(allocator<char> *)&ss);
  for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1a8,result[uVar12]);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)&result_str);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::append((char *)&result_str);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  _ss = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  std::operator<<((ostream *)local_1b0,"Result vector is equal to ");
  std::operator<<((ostream *)local_1b0,result_str._M_dataplus._M_p);
  std::operator<<((ostream *)local_1b0,", but ");
  std::operator<<((ostream *)local_1b0,reference_str._M_dataplus._M_p);
  std::operator<<((ostream *)local_1b0," was expected.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&ss,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::__cxx11::string::~string((string *)&result_str);
  std::__cxx11::string::~string((string *)&reference_str);
LAB_00b1f167:
  return (long)(int)uVar5 <= (long)uVar14;
}

Assistant:

bool AttributeFormatTest::DrawAndCheck(glw::GLint size, bool normalized)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Draw. */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	T* result_ptr = (T*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	T result[8] = { 0 };

	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		result[i] = result_ptr[i];
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	const glw::GLdouble scale = normalized ? (1.0 / 16.0) /* Floating point scalling factor. */ : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	T reference[8] = { 0 };

	for (glw::GLint i = 0; i < 2 /* two points */; ++i)
	{
		for (glw::GLint j = 0; j < size /* size components */; ++j)
		{
			reference[i * size + j] = array_data[i * size * 2 + j] + array_data[i * size * 2 + j + size];
		}
	}

	/* Check result and return. */
	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		if (!AttributeFormatTest::compare<T>(reference[i], result[i]))
		{
			std::string reference_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << reference[j];

				reference_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					reference_str.append(", ");
				}
				else
				{
					reference_str.append(" ]");
				}
			}

			std::string result_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << result[j];

				result_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					result_str.append(", ");
				}
				else
				{
					result_str.append(" ]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to "
												<< result_str.c_str() << ", but " << reference_str.c_str()
												<< " was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}